

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_menu_begin_image_text
              (nk_context *ctx,char *title,int len,nk_flags align,nk_image img,nk_vec2 size)

{
  nk_widget_layout_states nVar1;
  int iVar2;
  nk_context *local_78;
  uint local_64;
  nk_flags state;
  int is_clicked;
  nk_input *in;
  nk_rect header;
  nk_window *win;
  nk_flags align_local;
  int len_local;
  char *title_local;
  nk_context *ctx_local;
  nk_vec2 size_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x43ac,
                  "int nk_menu_begin_image_text(struct nk_context *, const char *, int, nk_flags, struct nk_image, struct nk_vec2)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
         (ctx->current->layout == (nk_panel *)0x0)) {
        size_local.x = 0.0;
      }
      else {
        header._8_8_ = ctx->current;
        nVar1 = nk_widget((nk_rect *)&in,ctx);
        if (nVar1 == NK_WIDGET_INVALID) {
          size_local.x = 0.0;
        }
        else {
          if ((nVar1 == NK_WIDGET_ROM) ||
             (local_78 = ctx, (*(uint *)(*(long *)(header._8_8_ + 0xa8) + 4) & 0x1000) != 0)) {
            local_78 = (nk_context *)0x0;
          }
          iVar2 = nk_do_button_text_image
                            (&ctx->last_widget_state,(nk_command_buffer *)(header._8_8_ + 0x68),_in,
                             img,title,len,align,NK_BUTTON_DEFAULT,&(ctx->style).menu_button,
                             (ctx->style).font,&local_78->input);
          local_64 = (uint)(iVar2 != 0);
          size_local.x = (float)nk_menu_begin(ctx,(nk_window *)header._8_8_,title,local_64,_in,size)
          ;
        }
      }
      return (int)size_local.x;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x43ae,
                  "int nk_menu_begin_image_text(struct nk_context *, const char *, int, nk_flags, struct nk_image, struct nk_vec2)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x43ad,
                "int nk_menu_begin_image_text(struct nk_context *, const char *, int, nk_flags, struct nk_image, struct nk_vec2)"
               );
}

Assistant:

NK_API int
nk_menu_begin_image_text(struct nk_context *ctx, const char *title, int len,
    nk_flags align, struct nk_image img, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_rect header;
    const struct nk_input *in;
    int is_clicked = nk_false;
    nk_flags state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    state = nk_widget(&header, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || win->layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    if (nk_do_button_text_image(&ctx->last_widget_state, &win->buffer,
        header, img, title, len, align, NK_BUTTON_DEFAULT, &ctx->style.menu_button,
        ctx->style.font, in))
        is_clicked = nk_true;
    return nk_menu_begin(ctx, win, title, is_clicked, header, size);
}